

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O2

pair<bool,_unsigned_long> __thiscall
IdentifierTokenizerRule::tryMatch(IdentifierTokenizerRule *this,shared_ptr<Readable> *reader)

{
  element_type *peVar1;
  char cVar2;
  unsigned_long uVar3;
  bool bVar4;
  int iVar5;
  unsigned_long uVar6;
  ulong unaff_R15;
  pair<bool,_unsigned_long> pVar7;
  
  peVar1 = (reader->super___shared_ptr<Readable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  iVar5 = (*peVar1->_vptr_Readable[2])(peVar1,0);
  cVar2 = (char)iVar5;
  if (((byte)(cVar2 + 0x9fU) < 0x1a) || (cVar2 == '_' || (byte)(cVar2 + 0xbfU) < 0x1a)) {
    uVar3 = 1;
    do {
      uVar6 = uVar3;
      peVar1 = (reader->super___shared_ptr<Readable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      iVar5 = (*peVar1->_vptr_Readable[2])(peVar1,uVar6);
      unaff_R15 = CONCAT71((int7)(unaff_R15 >> 8),1);
      if ((char)iVar5 == '\0') break;
      peVar1 = (reader->super___shared_ptr<Readable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      iVar5 = (*peVar1->_vptr_Readable[2])(peVar1,uVar6);
      bVar4 = isLiteralRest((char)iVar5);
      uVar3 = uVar6 + 1;
    } while (bVar4);
  }
  else {
    unaff_R15 = 0;
    uVar6 = 0;
  }
  pVar7._0_8_ = unaff_R15 & 0xffffffff;
  pVar7.second = uVar6;
  return pVar7;
}

Assistant:

std::pair<bool, std::size_t> tryMatch(std::shared_ptr<Readable> reader) noexcept override {
    std::size_t i = 0;

    if (!isLiteralFirst(reader->charAt(i))) {
      return std::make_pair(false, 0);
    }

    i++;

    for (; reader->charAt(i) != '\0'; i++) {
      if (!isLiteralRest(reader->charAt(i))) {
        break;
      }
    }

    return std::make_pair(true, i);
  }